

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

int SSL_marshal_ech_config
              (uint8_t **out,size_t *out_len,uint8_t config_id,EVP_HPKE_KEY *key,char *public_name,
              size_t max_name_len)

{
  bool bVar1;
  uint16_t value;
  int iVar2;
  int iVar3;
  uchar *len;
  EVP_HPKE_KEM *kem;
  size_t extraout_RDX;
  Span<const_unsigned_char> public_name_00;
  size_t public_key_len;
  uint8_t *public_key;
  CBB child;
  CBB contents;
  ScopedCBB cbb;
  
  len = (uchar *)strlen(public_name);
  public_name_00.size_ = extraout_RDX;
  public_name_00.data_ = len;
  bVar1 = bssl::ssl_is_valid_ech_public_name((bssl *)public_name,public_name_00);
  if (!bVar1) {
    iVar2 = 0x13d;
    iVar3 = 0x3d0;
LAB_0020949b:
    ERR_put_error(0x10,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,iVar3);
    return 0;
  }
  if (0xff < max_name_len) {
    iVar2 = 0x6f;
    iVar3 = 0x3d6;
    goto LAB_0020949b;
  }
  CBB_zero(&cbb.ctx_);
  iVar2 = CBB_init(&cbb.ctx_,0x80);
  if ((((iVar2 != 0) && (iVar2 = CBB_add_u16(&cbb.ctx_,0xfe0d), iVar2 != 0)) &&
      (iVar2 = CBB_add_u16_length_prefixed(&cbb.ctx_,&contents), iVar2 != 0)) &&
     (iVar2 = CBB_add_u8(&contents,config_id), iVar2 != 0)) {
    kem = EVP_HPKE_KEY_kem(key);
    value = EVP_HPKE_KEM_id(kem);
    iVar2 = CBB_add_u16(&contents,value);
    if ((((iVar2 != 0) && (iVar2 = CBB_add_u16_length_prefixed(&contents,&child), iVar2 != 0)) &&
        ((iVar2 = CBB_reserve(&child,&public_key,0x41), iVar2 != 0 &&
         ((iVar2 = EVP_HPKE_KEY_public_key(key,public_key,&public_key_len,0x41), iVar2 != 0 &&
          (iVar2 = CBB_did_write(&child,public_key_len), iVar2 != 0)))))) &&
       ((iVar2 = CBB_add_u16_length_prefixed(&contents,&child), iVar2 != 0 &&
        ((iVar2 = CBB_add_u16(&child,1), iVar2 != 0 && (iVar2 = CBB_add_u16(&child,1), iVar2 != 0)))
        ))) {
      iVar2 = 1;
      iVar3 = CBB_add_u16(&child,1);
      if (((iVar3 != 0) &&
          ((((iVar3 = CBB_add_u16(&child,3), iVar3 != 0 &&
             (iVar3 = CBB_add_u8(&contents,(uint8_t)max_name_len), iVar3 != 0)) &&
            (iVar3 = CBB_add_u8_length_prefixed(&contents,&child), iVar3 != 0)) &&
           ((iVar3 = CBB_add_bytes(&child,(uint8_t *)public_name,(size_t)len), iVar3 != 0 &&
            (iVar3 = CBB_add_u16(&contents,0), iVar3 != 0)))))) &&
         (iVar3 = CBB_finish(&cbb.ctx_,out,out_len), iVar3 != 0)) goto LAB_00209687;
    }
  }
  iVar2 = 0;
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,0x3f6);
LAB_00209687:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  return iVar2;
}

Assistant:

int SSL_marshal_ech_config(uint8_t **out, size_t *out_len, uint8_t config_id,
                           const EVP_HPKE_KEY *key, const char *public_name,
                           size_t max_name_len) {
  Span<const uint8_t> public_name_u8 = StringAsBytes(public_name);
  if (!ssl_is_valid_ech_public_name(public_name_u8)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ECH_PUBLIC_NAME);
    return 0;
  }

  // The maximum name length is encoded in one byte.
  if (max_name_len > 0xff) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
    return 0;
  }

  // See draft-ietf-tls-esni-13, section 4.
  ScopedCBB cbb;
  CBB contents, child;
  uint8_t *public_key;
  size_t public_key_len;
  if (!CBB_init(cbb.get(), 128) ||  //
      !CBB_add_u16(cbb.get(), kECHConfigVersion) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &contents) ||
      !CBB_add_u8(&contents, config_id) ||
      !CBB_add_u16(&contents, EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(key))) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      !CBB_reserve(&child, &public_key, EVP_HPKE_MAX_PUBLIC_KEY_LENGTH) ||
      !EVP_HPKE_KEY_public_key(key, public_key, &public_key_len,
                               EVP_HPKE_MAX_PUBLIC_KEY_LENGTH) ||
      !CBB_did_write(&child, public_key_len) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      // Write a default cipher suite configuration.
      !CBB_add_u16(&child, EVP_HPKE_HKDF_SHA256) ||
      !CBB_add_u16(&child, EVP_HPKE_AES_128_GCM) ||
      !CBB_add_u16(&child, EVP_HPKE_HKDF_SHA256) ||
      !CBB_add_u16(&child, EVP_HPKE_CHACHA20_POLY1305) ||
      !CBB_add_u8(&contents, max_name_len) ||
      !CBB_add_u8_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(&child, public_name_u8.data(), public_name_u8.size()) ||
      // TODO(https://crbug.com/boringssl/275): Reserve some GREASE extensions
      // and include some.
      !CBB_add_u16(&contents, 0 /* no extensions */) ||
      !CBB_finish(cbb.get(), out, out_len)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return 0;
  }
  return 1;
}